

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::drawSurface
          (SeparateShaderTest *this,Surface *dst,deUint32 seed)

{
  CallLogWrapper *this_00;
  RenderContext *context;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  GLenum err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *data;
  int width;
  Random rnd;
  TextureFormat local_70;
  deRandom local_68;
  PixelBufferAccess local_58;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  if (seed == 0) {
    seed = deRandom_getUint32(&(this->m_rnd).m_rnd);
  }
  deRandom_init(&local_68,seed);
  iVar3 = (*context->_vptr_RenderContext[4])(context);
  iVar5 = *(int *)CONCAT44(extraout_var,iVar3);
  width = 0x80;
  if (iVar5 < 0x80) {
    width = iVar5;
  }
  dVar4 = deRandom_getUint32(&local_68);
  uVar1 = (ulong)dVar4 % (ulong)((iVar5 - width) + 1);
  iVar5 = ((int *)CONCAT44(extraout_var,iVar3))[1];
  iVar3 = 0x80;
  if (iVar5 < 0x80) {
    iVar3 = iVar5;
  }
  dVar4 = deRandom_getUint32(&local_68);
  uVar2 = (ulong)dVar4 % (ulong)((iVar5 - iVar3) + 1);
  this_00 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glClearColor(this_00,0.125,0.25,0.5,1.0);
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x1a00))(uVar1,uVar2,width,iVar3);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
  err = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(err,"glDrawArrays(GL_TRIANGLES, 0, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x52a);
  tcu::Surface::setSize(dst,width,iVar3);
  local_70.order = RGBA;
  local_70.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_58,&local_70,dst->m_width,dst->m_height,1,data);
  glu::readPixels(context,(int)uVar1,(int)uVar2,&local_58);
  tcu::TestLog::writeMessage
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             "// Drew a triangle");
  return;
}

Assistant:

void SeparateShaderTest::drawSurface (Surface& dst, deUint32 seed)
{
	const RenderContext&	renderCtx	= getRenderContext();
	Random					rnd			(seed > 0 ? seed : m_rnd.getUint32());
	Rectangle				viewport	= randomViewport(renderCtx, rnd,
														 VIEWPORT_SIZE, VIEWPORT_SIZE);
	glClearColor(0.125f, 0.25f, 0.5f, 1.f);
	setViewport(renderCtx, viewport);
	glClear(GL_COLOR_BUFFER_BIT);
	GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 3));
	readRectangle(renderCtx, viewport, dst);
	log().writeMessage("// Drew a triangle");
}